

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_ObjDup(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  Wlc_Obj_t *p_00;
  Wlc_Obj_t *pObj_00;
  Wlc_Obj_t *pObjNew;
  int iFaninNew;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  p_00 = Wlc_NtkObj(p,iObj);
  uVar1 = *(ushort *)p_00;
  iVar2 = Wlc_ObjIsSigned(p_00);
  iVar2 = Wlc_ObjAlloc(pNew,(uint)(uVar1 & 0x3f),iVar2,p_00->End,p_00->Beg);
  pObj_00 = Wlc_NtkObj(pNew,iVar2);
  Wlc_ObjCollectCopyFanins(p,iObj,vFanins);
  Wlc_ObjAddFanins(pNew,pObj_00,vFanins);
  Wlc_ObjSetCopy(p,iObj,iVar2);
  *(ushort *)pObj_00 = *(ushort *)pObj_00 & 0xf7ff | (*(ushort *)p_00 >> 0xb & 1) << 0xb;
  return iVar2;
}

Assistant:

int Wlc_ObjDup( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    int iFaninNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
    Wlc_Obj_t * pObjNew = Wlc_NtkObj(pNew, iFaninNew);
    Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
    Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
    Wlc_ObjSetCopy( p, iObj, iFaninNew );
    pObjNew->fXConst = pObj->fXConst;
    return iFaninNew;
}